

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O3

void __thiscall Fl_File_Chooser::update_preview(Fl_File_Chooser *this)

{
  int iVar1;
  Fl_Box *pFVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  char *n;
  FILE *__stream;
  size_t sVar6;
  Fl_Shared_Image *pFVar7;
  undefined4 extraout_var;
  Fl_Fontsize FVar8;
  uint uVar9;
  Fl_Widget *pFVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  byte bVar15;
  Fl_Shared_Image *this_00;
  stat s;
  stat local_c0;
  ulong uVar10;
  
  if ((this->previewButton->super_Fl_Light_Button).super_Fl_Button.value_ == '\0') {
    return;
  }
  n = value(this,1);
  if (n == (char *)0x0) {
    bVar3 = false;
LAB_001aa58d:
    this_00 = (Fl_Shared_Image *)0x0;
LAB_001aa590:
    pcVar13 = (char *)0x0;
  }
  else {
    iVar5 = fl_filename_isdir(n);
    if (iVar5 == 0) {
      iVar5 = fl_stat(n,&local_c0);
      bVar3 = true;
      if (iVar5 != 0) goto LAB_001aa58d;
      if ((local_c0.st_mode & 0xf000) == 0x8000) {
        if (local_c0.st_size != 0) {
          Fl_Window::cursor(&this->window->super_Fl_Window,FL_CURSOR_WAIT);
          Fl::check();
          pFVar7 = Fl_Shared_Image::get(n,0,0);
          this_00 = (Fl_Shared_Image *)0x0;
          if (pFVar7 != (Fl_Shared_Image *)0x0) {
            bVar3 = false;
            Fl_Window::cursor(&this->window->super_Fl_Window,FL_CURSOR_DEFAULT);
            Fl::check();
            this_00 = pFVar7;
          }
          goto LAB_001aa590;
        }
        pcVar13 = "<empty file>";
      }
      else {
        pcVar13 = "@-3refresh";
      }
    }
    else {
      pcVar13 = "@fileopen";
    }
    bVar3 = false;
    this_00 = (Fl_Shared_Image *)0x0;
  }
  pFVar11 = &this->previewBox->super_Fl_Widget;
  pFVar7 = (Fl_Shared_Image *)(pFVar11->label_).image;
  if (pFVar7 != (Fl_Shared_Image *)0x0) {
    Fl_Shared_Image::release(pFVar7);
    pFVar11 = &this->previewBox->super_Fl_Widget;
  }
  (pFVar11->label_).image = (Fl_Image *)0x0;
  if (!bVar3) {
    if (this_00 == (Fl_Shared_Image *)0x0) {
      if (pcVar13 != (char *)0x0) {
        Fl_Widget::label(pFVar11,pcVar13);
        pFVar2 = this->previewBox;
        (pFVar2->super_Fl_Widget).label_.align_ = 0x40;
        FVar8 = 0xc;
        if (*pcVar13 == '@') {
          FVar8 = 0x4b;
        }
        (pFVar2->super_Fl_Widget).label_.size = FVar8;
        (pFVar2->super_Fl_Widget).label_.font = 0;
      }
    }
    else {
      iVar5 = (this_00->super_Fl_Image).w_;
      if ((((iVar5 < 1) || (iVar1 = (this_00->super_Fl_Image).h_, iVar1 < 1)) ||
          ((this_00->super_Fl_Image).d_ < 0)) || ((this_00->super_Fl_Image).count_ < 1)) {
        Fl_Widget::label(pFVar11,"X");
        pFVar11 = &this->previewBox->super_Fl_Widget;
        (pFVar11->label_).align_ = 0x40;
        (pFVar11->label_).font = 0;
        (pFVar11->label_).size = 0x46;
        Fl_Widget::redraw(pFVar11);
      }
      else {
        uVar9 = pFVar11->w_ - 0x14;
        uVar10 = (ulong)uVar9;
        uVar12 = pFVar11->h_ - 0x14;
        if (((int)uVar9 < iVar5) || ((int)uVar12 < iVar1)) {
          uVar9 = (int)(uVar9 * iVar1) / iVar5;
          if ((int)uVar12 < (int)uVar9) {
            uVar10 = (long)(int)(iVar5 * uVar12) / (long)iVar1 & 0xffffffff;
            uVar9 = uVar12;
          }
          iVar5 = (*(this_00->super_Fl_Image)._vptr_Fl_Image[2])(this_00,uVar10,(ulong)uVar9);
          (this->previewBox->super_Fl_Widget).label_.image =
               (Fl_Image *)CONCAT44(extraout_var,iVar5);
          Fl_Shared_Image::release(this_00);
          pFVar11 = &this->previewBox->super_Fl_Widget;
        }
        else {
          (pFVar11->label_).image = &this_00->super_Fl_Image;
        }
        (pFVar11->label_).align_ = 0x40;
        Fl_Widget::label(pFVar11,(char *)0x0);
      }
    }
    goto LAB_001aa9d4;
  }
  if ((n == (char *)0x0) || (__stream = (FILE *)fl_fopen(n,"rb"), __stream == (FILE *)0x0)) {
    this->preview_text_[0] = '\0';
  }
  else {
    sVar6 = fread(this->preview_text_,1,0x7ff,__stream);
    this->preview_text_[(int)sVar6] = '\0';
    fclose(__stream);
  }
  Fl_Window::cursor(&this->window->super_Fl_Window,FL_CURSOR_DEFAULT);
  Fl::check();
  bVar15 = this->preview_text_[0];
  if (bVar15 != 0) {
    lVar14 = 0x1010;
    bVar4 = bVar15;
    do {
      uVar9 = (uint)bVar4;
      if ((char)bVar4 < '\0') {
        if ((uVar9 & 0xffffffe0) == 0xc0) {
          if (this->directory_[lVar14 + -0xf] != '\0') break;
          lVar14 = lVar14 + 1;
        }
        else if ((uVar9 & 0xfffffff0) == 0xe0) {
          if (this->directory_[lVar14 + -0xf] != '\0') break;
          if (this->directory_[lVar14 + -0xe] != '\0') {
LAB_001aa97c:
            lVar14 = lVar14 + 1;
            break;
          }
          lVar14 = lVar14 + 2;
        }
        else if ((bVar4 & 0xfffffff8) == 0xf0) {
          if (this->directory_[lVar14 + -0xf] != '\0') break;
          if (this->directory_[lVar14 + -0xe] != '\0') goto LAB_001aa97c;
          if (this->directory_[lVar14 + -0xd] != '\0') {
            lVar14 = lVar14 + 2;
            break;
          }
          lVar14 = lVar14 + 3;
        }
      }
      else {
        iVar5 = isprint((uint)bVar4);
        if ((iVar5 == 0) && (iVar5 = isspace(uVar9), iVar5 == 0)) break;
      }
      bVar4 = this->directory_[lVar14 + -0xf];
      lVar14 = lVar14 + 1;
    } while (bVar4 != 0);
    if ((lVar14 == 0x1010) || (this->directory_[lVar14 + -0x10] != '\0')) {
      if (bVar15 == 0) goto LAB_001aa858;
      lVar14 = 0x1010;
      do {
        iVar5 = isprint((uint)bVar15);
        if ((iVar5 == 0) && (iVar5 = isspace((uint)bVar15), iVar5 == 0)) break;
        bVar15 = this->directory_[lVar14 + -0xf];
        lVar14 = lVar14 + 1;
      } while (bVar15 != 0);
    }
    if ((lVar14 != 0x1010) && (this->directory_[lVar14 + -0x10] == '\0')) {
      uVar9 = (this->previewBox->super_Fl_Widget).h_;
      uVar12 = 6;
      if ((0x77 < (int)uVar9) &&
         (uVar9 = uVar9 / 0x14, uVar12 = FL_NORMAL_SIZE, (int)uVar9 < FL_NORMAL_SIZE)) {
        uVar12 = uVar9;
      }
      Fl_Widget::label(&this->previewBox->super_Fl_Widget,this->preview_text_);
      pFVar2 = this->previewBox;
      (pFVar2->super_Fl_Widget).label_.align_ = 0x55;
      (pFVar2->super_Fl_Widget).label_.size = uVar12;
      (pFVar2->super_Fl_Widget).label_.font = 4;
      goto LAB_001aa9d4;
    }
  }
LAB_001aa858:
  pcVar13 = "?";
  if (n == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  Fl_Widget::label(&this->previewBox->super_Fl_Widget,pcVar13);
  pFVar2 = this->previewBox;
  (pFVar2->super_Fl_Widget).label_.align_ = 0x40;
  (pFVar2->super_Fl_Widget).label_.font = 0;
  (pFVar2->super_Fl_Widget).label_.size = 0x4b;
LAB_001aa9d4:
  Fl_Widget::redraw(&this->previewBox->super_Fl_Widget);
  return;
}

Assistant:

void
Fl_File_Chooser::update_preview()
{
  const char		*filename;	// Current filename
  const char            *newlabel = 0;  // New label text
  Fl_Shared_Image	*image = 0,     // New image
			*oldimage;	// Old image
  int			pbw, pbh;	// Width and height of preview box
  int			w, h;		// Width and height of preview image
  int                   set = 0;        // Set this flag as soon as a decent preview is found

  if (!previewButton->value()) return;

  filename = value();
  if (filename == NULL) {
    // no file name at all, so we have an empty preview
    set = 1;
  } else if (fl_filename_isdir(filename)) {
    // filename is a directory, show a folder icon
    newlabel = "@fileopen";
    set = 1;
  } else {
    struct stat s;
    if (fl_stat(filename, &s)==0) {
      if ((s.st_mode&S_IFMT)!=S_IFREG) {
        // this is no regular file, probably some kind of device
        newlabel = "@-3refresh"; // a cross
        set = 1;
      } else if (s.st_size==0) {
        // this file is emty
        newlabel = "<empty file>";
        set = 1;
      } else {
        // if this file is an image, try to load it
        window->cursor(FL_CURSOR_WAIT);
        Fl::check();
        
        image = Fl_Shared_Image::get(filename);
        
        if (image) {
          window->cursor(FL_CURSOR_DEFAULT);
          Fl::check();
          set = 1;
        }
      }
    }
  }

  oldimage = (Fl_Shared_Image *)previewBox->image();

  if (oldimage) oldimage->release();

  previewBox->image(0);

  if (!set) {
    FILE	*fp;
    int		bytes;
    char	*ptr;

    if (filename) fp = fl_fopen(filename, "rb");
    else fp = NULL;

    if (fp != NULL) {
      // Try reading the first 1k of data for a label...
      bytes = (int) fread(preview_text_, 1, sizeof(preview_text_) - 1, fp);
      preview_text_[bytes] = '\0';
      fclose(fp);
    } else {
      // Assume we can't read any data...
      preview_text_[0] = '\0';
    }

    window->cursor(FL_CURSOR_DEFAULT);
    Fl::check();

    // Scan the buffer for printable UTF8 chars...
    for (ptr = preview_text_; *ptr; ptr++) {
      uchar c = uchar(*ptr);
      if ( (c&0x80)==0 ) {
        if (!isprint(c&255) && !isspace(c&255)) break;
      } else if ( (c&0xe0)==0xc0 ) {
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
      } else if ( (c&0xf0)==0xe0 ) {
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
      } else if ( (c&0xf8)==0xf0 ) {
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
      }
    } 
//         *ptr && (isprint(*ptr & 255) || isspace(*ptr & 255));
//	 ptr ++);

    // Scan the buffer for printable characters in 8 bit
    if (*ptr || ptr == preview_text_) {
      for (ptr = preview_text_;
         *ptr && (isprint(*ptr & 255) || isspace(*ptr & 255));
	 ptr ++) {/*empty*/}
    }

    if (*ptr || ptr == preview_text_) {
      // Non-printable file, just show a big ?...
      previewBox->label(filename ? "?" : 0);
      previewBox->align(FL_ALIGN_CLIP);
      previewBox->labelsize(75);
      previewBox->labelfont(FL_HELVETICA);
    } else {
      // Show the first 1k of text...
      int size = previewBox->h() / 20;
      if (size < 6) size = 6;
      else if (size > FL_NORMAL_SIZE) size = FL_NORMAL_SIZE;

      previewBox->label(preview_text_);
      previewBox->align((Fl_Align)(FL_ALIGN_CLIP | FL_ALIGN_INSIDE |
                                   FL_ALIGN_LEFT | FL_ALIGN_TOP));
      previewBox->labelsize(size);
      previewBox->labelfont(FL_COURIER);
    }
  } else if (image && ( (image->w() <= 0) ||
                        (image->h() <= 0) ||
                        (image->d() < 0)  ||
                        (image->count() <= 0))) {
    // Image has errors? Show big 'X'
    previewBox->label("X");
    previewBox->align(FL_ALIGN_CLIP);
    previewBox->labelsize(70);
    previewBox->labelfont(FL_HELVETICA);
    previewBox->redraw();
  } else if (image) {
    pbw = previewBox->w() - 20;
    pbh = previewBox->h() - 20;

    if (image->w() > pbw || image->h() > pbh) {
      w   = pbw;
      h   = w * image->h() / image->w();

      if (h > pbh) {
	h = pbh;
	w = h * image->w() / image->h();
      }

      oldimage = (Fl_Shared_Image *)image->copy(w, h);
      previewBox->image((Fl_Image *)oldimage);

      image->release();
    } else {
      previewBox->image((Fl_Image *)image);
    }

    previewBox->align(FL_ALIGN_CLIP);
    previewBox->label(0);
  } else if (newlabel) {
    previewBox->label(newlabel);
    previewBox->align(FL_ALIGN_CLIP);
    previewBox->labelsize(newlabel[0]=='@'?75:12);
    previewBox->labelfont(FL_HELVETICA);
  }

  previewBox->redraw();
}